

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_symbolCaptureBinding_create
          (sysbvm_context_t *context,sysbvm_tuple_t capturedBinding,sysbvm_tuple_t ownerFunction,
          size_t vectorIndex)

{
  _Bool _Var1;
  sysbvm_object_tuple_t *psVar2;
  sysbvm_tuple_t sVar3;
  sysbvm_symbolCaptureBinding_t *result;
  sysbvm_symbolBinding_t *capturedBindingObject;
  size_t vectorIndex_local;
  sysbvm_tuple_t ownerFunction_local;
  sysbvm_tuple_t capturedBinding_local;
  sysbvm_context_t *context_local;
  
  _Var1 = sysbvm_tuple_isKindOf(context,capturedBinding,(context->roots).symbolBindingType);
  if (!_Var1) {
    sysbvm_error("Expected a symbol binding");
  }
  psVar2 = sysbvm_context_allocatePointerTuple(context,(context->roots).symbolCaptureBindingType,8);
  psVar2[1].field_1 =
       *(anon_union_8_2_52f2f10a_for_sysbvm_object_tuple_s_1 *)(capturedBinding + 0x28);
  psVar2->field_1 = *(anon_union_8_2_52f2f10a_for_sysbvm_object_tuple_s_1 *)(capturedBinding + 0x10)
  ;
  psVar2[2].header.field_0 =
       *(anon_union_8_3_721b4b48_for_sysbvm_tuple_header_s_0 *)(capturedBinding + 0x30);
  psVar2[2].header.identityHashAndFlags = (int)ownerFunction;
  psVar2[2].header.objectSize = (int)(ownerFunction >> 0x20);
  sVar3 = sysbvm_tuple_size_encode(context,vectorIndex);
  psVar2[2].field_1.pointers[0] = sVar3;
  psVar2[3].header.field_0.typePointer = capturedBinding;
  return (sysbvm_tuple_t)psVar2;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_symbolCaptureBinding_create(sysbvm_context_t *context, sysbvm_tuple_t capturedBinding, sysbvm_tuple_t ownerFunction, size_t vectorIndex)
{
    if(!sysbvm_tuple_isKindOf(context, capturedBinding, context->roots.symbolBindingType))
        sysbvm_error("Expected a symbol binding");

    sysbvm_symbolBinding_t *capturedBindingObject = (sysbvm_symbolBinding_t*)capturedBinding;

    sysbvm_symbolCaptureBinding_t *result = (sysbvm_symbolCaptureBinding_t*)sysbvm_context_allocatePointerTuple(context, context->roots.symbolCaptureBindingType, SYSBVM_SLOT_COUNT_FOR_STRUCTURE_TYPE(sysbvm_symbolCaptureBinding_t));
    result->super.super.sourcePosition = capturedBindingObject->sourcePosition;
    result->super.super.super.name = capturedBindingObject->super.name;
    result->super.super.type = capturedBindingObject->type;
    result->super.ownerFunction = ownerFunction;
    result->super.vectorIndex = sysbvm_tuple_size_encode(context, vectorIndex);
    result->capturedBinding = capturedBinding;
    return (sysbvm_tuple_t)result;
}